

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_circle_sector_lines
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  _Bool _Var1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 local_48;
  rf_int i;
  int limit;
  _Bool show_cap_lines;
  float angle;
  float step_length;
  float th;
  float CIRCLE_ERROR_RATE;
  int tmp;
  int segments_local;
  int end_angle_local;
  int start_angle_local;
  float radius_local;
  rf_color color_local;
  rf_vec2 center_local;
  
  end_angle_local = (int)radius;
  if (radius <= 0.0) {
    end_angle_local = 0x3dcccccd;
  }
  tmp = end_angle;
  segments_local = start_angle;
  if (end_angle < start_angle) {
    tmp = start_angle;
    segments_local = end_angle;
  }
  CIRCLE_ERROR_RATE = (float)segments;
  if (segments < 4) {
    fVar3 = powf(1.0 - 0.5 / (float)end_angle_local,2.0);
    fVar3 = acosf(fVar3 + fVar3 + -1.0);
    fVar3 = ceilf(6.2831855 / fVar3);
    CIRCLE_ERROR_RATE = (float)(int)(((float)(tmp - segments_local) * fVar3) / 360.0);
    if ((int)CIRCLE_ERROR_RATE < 1) {
      CIRCLE_ERROR_RATE = 5.60519e-45;
    }
  }
  fVar3 = (float)(tmp - segments_local) / (float)(int)CIRCLE_ERROR_RATE;
  limit = (int)(float)segments_local;
  i._0_4_ = ((int)CIRCLE_ERROR_RATE + 2) * 2;
  bVar2 = (tmp - segments_local) % 0x168 == 0;
  if (bVar2) {
    i._0_4_ = (int)CIRCLE_ERROR_RATE << 1;
  }
  i._7_1_ = !bVar2;
  _Var1 = rf_gfx_check_buffer_limit((int)i);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  start_angle_local._0_1_ = color.r;
  start_angle_local._1_1_ = color.g;
  start_angle_local._2_1_ = color.b;
  start_angle_local._3_1_ = color.a;
  radius_local = center.x;
  color_local = (rf_color)center.y;
  if (i._7_1_) {
    rf_gfx_color4ub((uchar)start_angle_local,start_angle_local._1_1_,start_angle_local._2_1_,
                    start_angle_local._3_1_);
    rf_gfx_vertex2f(radius_local,(float)color_local);
    fVar4 = sinf((float)limit * 0.017453292);
    fVar5 = cosf((float)limit * 0.017453292);
    rf_gfx_vertex2f(fVar4 * (float)end_angle_local + radius_local,
                    fVar5 * (float)end_angle_local + (float)color_local);
  }
  for (local_48 = 0; local_48 < (int)CIRCLE_ERROR_RATE; local_48 = local_48 + 1) {
    rf_gfx_color4ub((uchar)start_angle_local,start_angle_local._1_1_,start_angle_local._2_1_,
                    start_angle_local._3_1_);
    fVar4 = sinf((float)limit * 0.017453292);
    fVar5 = cosf((float)limit * 0.017453292);
    rf_gfx_vertex2f(fVar4 * (float)end_angle_local + radius_local,
                    fVar5 * (float)end_angle_local + (float)color_local);
    fVar4 = sinf(((float)limit + fVar3) * 0.017453292);
    fVar5 = cosf(((float)limit + fVar3) * 0.017453292);
    rf_gfx_vertex2f(fVar4 * (float)end_angle_local + radius_local,
                    fVar5 * (float)end_angle_local + (float)color_local);
    limit = (int)(fVar3 + (float)limit);
  }
  if (i._7_1_) {
    rf_gfx_color4ub((uchar)start_angle_local,start_angle_local._1_1_,start_angle_local._2_1_,
                    start_angle_local._3_1_);
    rf_gfx_vertex2f(radius_local,(float)color_local);
    fVar3 = sinf((float)limit * 0.017453292);
    fVar4 = cosf((float)limit * 0.017453292);
    rf_gfx_vertex2f(fVar3 * (float)end_angle_local + radius_local,
                    fVar4 * (float)end_angle_local + (float)color_local);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector_lines(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero issue

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;

    // Hide the cap lines when the circle is full
    bool show_cap_lines = true;
    int limit = 2*(segments + 2);
    if ((end_angle - start_angle)%360 == 0) { limit = 2*segments; show_cap_lines = false; }

    if (rf_gfx_check_buffer_limit(limit)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
    }

    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }

    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
    }
    rf_gfx_end();
}